

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vec4f * __thiscall
Shader::vertex(vec4f *__return_storage_ptr__,Shader *this,Model *model,int iface,int nthvert)

{
  size_t idx;
  double *rhs;
  vec<4UL,_double> local_1a0;
  vec<3UL,_double> local_180;
  vec3f local_168;
  vec<4UL,_double> local_150;
  mat<4UL,_4UL> local_130;
  mat<4UL,_4UL> local_b0;
  vec2f local_30;
  int local_20;
  int local_1c;
  int nthvert_local;
  int iface_local;
  Model *model_local;
  Shader *this_local;
  
  local_20 = nthvert;
  local_1c = iface;
  _nthvert_local = model;
  model_local = (Model *)this;
  local_30 = Model::uv(model,(long)iface,(long)nthvert);
  mat<2UL,_3UL>::set_col(&this->varying_uv,(long)nthvert,&local_30);
  operator*(&local_130,&(this->super_IShader).uniform_Viewport,
            &(this->super_IShader).uniform_Projection);
  operator*(&local_b0,&local_130,&(this->super_IShader).uniform_ModelView);
  Model::vert(&local_168,_nthvert_local,(long)local_1c,(long)local_20);
  embed<4ul,3ul,double>(&local_150,&local_168,1.0);
  operator*(__return_storage_ptr__,&local_b0,&local_150);
  idx = (size_t)local_20;
  rhs = vec<4UL,_double>::operator[](__return_storage_ptr__,3);
  operator/(&local_1a0,__return_storage_ptr__,rhs);
  proj<3ul,4ul,double>(&local_180,&local_1a0);
  mat<3UL,_3UL>::set_col(&this->varying_tri,idx,&local_180);
  return __return_storage_ptr__;
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        varying_uv.set_col(nthvert, model.uv(iface, nthvert));
        vec4f gl_Vertex = uniform_Viewport * uniform_Projection * uniform_ModelView *
                          embed<4>(model.vert(iface, nthvert));
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));
        return gl_Vertex;
    }